

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O0

void oonf_class_add(oonf_class *ci)

{
  size_t sVar1;
  list_entity *plVar2;
  oonf_class *ci_local;
  
  sVar1 = _roundup(ci->size);
  ci->total_size = sVar1;
  (ci->_node).key = ci->name;
  avl_insert(&_classes_tree,&ci->_node);
  if (ci->to_keystring == (_func_char_ptr_oonf_objectkey_str_ptr_oonf_class_ptr_void_ptr *)0x0) {
    ci->to_keystring = _cb_to_keystring;
  }
  plVar2 = &ci->_free_list;
  (ci->_free_list).prev = plVar2;
  plVar2->next = plVar2;
  plVar2 = &ci->_extensions;
  (ci->_extensions).prev = plVar2;
  plVar2->next = plVar2;
  if ((log_global_mask[_oonf_class_subsystem.logging] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x83,
             (void *)0x0,0,"Class %s added: %zu bytes\n",ci->name,ci->total_size);
  }
  return;
}

Assistant:

void
oonf_class_add(struct oonf_class *ci) {
  /* round up size to make block extendable */
  ci->total_size = _roundup(ci->size);

  /* hook into tree */
  ci->_node.key = ci->name;
  avl_insert(&_classes_tree, &ci->_node);

  /* add standard key generator if necessary */
  if (ci->to_keystring == NULL) {
    ci->to_keystring = _cb_to_keystring;
  }

  /* Init list heads */
  list_init_head(&ci->_free_list);
  list_init_head(&ci->_extensions);

  OONF_DEBUG(LOG_CLASS, "Class %s added: %" PRINTF_SIZE_T_SPECIFIER " bytes\n", ci->name, ci->total_size);
}